

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O2

civil_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::MakeTime
          (civil_lookup *__return_storage_ptr__,TimeZoneLibC *this,civil_second *cs)

{
  ulong uVar1;
  undefined8 uVar2;
  fields fVar3;
  fields fVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  tm *ptVar8;
  tm *ptVar9;
  time_t tVar10;
  rep rVar11;
  long lVar12;
  diff_t dVar13;
  long lVar14;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> a;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> a_00;
  time_t t1;
  long local_100;
  long local_f8;
  time_t t0;
  int local_e4;
  long local_e0;
  tm tm1;
  tm tm0;
  tm tm;
  
  if (this->local_ == false) {
    dVar13 = 0x7fffffffffffffff;
    fVar3 = MakeTime::min_tp_cs.f_;
    if (MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
        ::min_tp_cs == '\0') {
      iVar7 = __cxa_guard_acquire(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                                   ::min_tp_cs);
      fVar3.m = MakeTime::min_tp_cs.f_.m;
      fVar3.d = MakeTime::min_tp_cs.f_.d;
      fVar3.hh = MakeTime::min_tp_cs.f_.hh;
      fVar3.mm = MakeTime::min_tp_cs.f_.mm;
      fVar3.ss = MakeTime::min_tp_cs.f_.ss;
      fVar3._13_3_ = MakeTime::min_tp_cs.f_._13_3_;
      fVar3.y = MakeTime::min_tp_cs.f_.y;
      if (iVar7 != 0) {
        a.f_.m = '\x01';
        a.f_.d = '\x01';
        a.f_.hh = '\0';
        a.f_.mm = '\0';
        a.f_.ss = '\0';
        a.f_._13_3_ = 0;
        a.f_.y = 0x7b2;
        MakeTime::min_tp_cs.f_ = (fields)detail::operator+(a,-0x8000000000000000);
        __cxa_guard_release(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                             ::min_tp_cs);
        fVar3 = MakeTime::min_tp_cs.f_;
      }
    }
    fVar4.m = MakeTime::max_tp_cs.f_.m;
    fVar4.d = MakeTime::max_tp_cs.f_.d;
    fVar4.hh = MakeTime::max_tp_cs.f_.hh;
    fVar4.mm = MakeTime::max_tp_cs.f_.mm;
    fVar4.ss = MakeTime::max_tp_cs.f_.ss;
    fVar4._13_3_ = MakeTime::max_tp_cs.f_._13_3_;
    fVar4.y = MakeTime::max_tp_cs.f_.y;
    MakeTime::min_tp_cs.f_ = fVar3;
    if (MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
        ::max_tp_cs == '\0') {
      iVar7 = __cxa_guard_acquire(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                                   ::max_tp_cs);
      fVar4.m = MakeTime::max_tp_cs.f_.m;
      fVar4.d = MakeTime::max_tp_cs.f_.d;
      fVar4.hh = MakeTime::max_tp_cs.f_.hh;
      fVar4.mm = MakeTime::max_tp_cs.f_.mm;
      fVar4.ss = MakeTime::max_tp_cs.f_.ss;
      fVar4._13_3_ = MakeTime::max_tp_cs.f_._13_3_;
      fVar4.y = MakeTime::max_tp_cs.f_.y;
      if (iVar7 != 0) {
        a_00.f_.m = '\x01';
        a_00.f_.d = '\x01';
        a_00.f_.hh = '\0';
        a_00.f_.mm = '\0';
        a_00.f_.ss = '\0';
        a_00.f_._13_3_ = 0;
        a_00.f_.y = 0x7b2;
        MakeTime::max_tp_cs.f_ = (fields)detail::operator+(a_00,0x7fffffffffffffff);
        __cxa_guard_release(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                             ::max_tp_cs);
        fVar4 = MakeTime::max_tp_cs.f_;
      }
    }
    MakeTime::max_tp_cs.f_ = fVar4;
    bVar6 = detail::operator<(cs,&MakeTime::min_tp_cs);
    if (bVar6) {
      dVar13 = -0x8000000000000000;
    }
    else {
      bVar6 = detail::operator<(&MakeTime::max_tp_cs,cs);
      if (!bVar6) {
        uVar2._0_1_ = (cs->f_).m;
        uVar2._1_1_ = (cs->f_).d;
        uVar2._2_1_ = (cs->f_).hh;
        uVar2._3_1_ = (cs->f_).mm;
        uVar2._4_1_ = (cs->f_).ss;
        uVar2._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
        dVar13 = detail::difference((detail *)(cs->f_).y,uVar2,0x7b2,0x101);
      }
    }
    __return_storage_ptr__->kind = UNIQUE;
    (__return_storage_ptr__->pre).__d.__r = dVar13;
    (__return_storage_ptr__->trans).__d.__r = dVar13;
    (__return_storage_ptr__->post).__d.__r = dVar13;
    goto LAB_0031e356;
  }
  uVar1 = (cs->f_).y;
  if ((long)uVar1 < 0) {
    if (0xffffffff8000076b < uVar1) goto LAB_0031e2b7;
    __return_storage_ptr__->kind = UNIQUE;
    t0 = -0x8000000000000000;
  }
  else if (uVar1 >> 2 < 0x200001db) {
LAB_0031e2b7:
    bVar6 = anon_unknown_10::make_time(cs,0,&t0,&tm0);
    if ((!bVar6) || (bVar6 = anon_unknown_10::make_time(cs,1,&t1,&tm1), tVar10 = t0, !bVar6)) {
      tm.tm_sec = 0x7b2;
      tm.tm_min = 0;
      tm.tm_hour = 0x101;
      tm.tm_mday._0_1_ = 0;
      bVar6 = detail::operator<(cs,(civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                    *)&tm);
      rVar11 = -0x8000000000000000;
      if (!bVar6) {
        rVar11 = 0x7fffffffffffffff;
      }
      __return_storage_ptr__->kind = UNIQUE;
      (__return_storage_ptr__->pre).__d.__r = rVar11;
      (__return_storage_ptr__->trans).__d.__r = rVar11;
      (__return_storage_ptr__->post).__d.__r = rVar11;
      goto LAB_0031e356;
    }
    if (tm0.tm_isdst != tm1.tm_isdst) {
      local_e4 = tm0.tm_isdst;
      lVar12 = tm0.tm_gmtoff;
      if (t0 < t1) {
        t0 = t1;
        t1 = tVar10;
        lVar12 = tm1.tm_gmtoff;
      }
      tVar10 = t0;
      local_100 = t1;
      do {
        lVar14 = tVar10;
        if (local_100 + 1 == tVar10) break;
        local_e0 = (tVar10 - local_100) / 2 + local_100;
        ptVar8 = localtime_r(&local_e0,(tm *)&tm);
        if (ptVar8 == (tm *)0x0) {
          do {
            local_100 = local_100 + 1;
            lVar5 = tVar10;
            if (local_100 == tVar10) goto LAB_0031e436;
            ptVar9 = localtime_r(&local_100,(tm *)&tm);
          } while ((ptVar9 == (tm *)0x0) || (ptVar9->tm_gmtoff != lVar12));
          local_f8 = local_100;
          lVar5 = local_f8;
        }
        else {
          lVar14 = local_e0;
          lVar5 = local_f8;
          if (ptVar8->tm_gmtoff != lVar12) {
            local_100 = local_e0;
            lVar14 = tVar10;
          }
        }
LAB_0031e436:
        local_f8 = lVar5;
        tVar10 = lVar14;
        lVar14 = local_f8;
      } while (ptVar8 != (tm *)0x0);
      local_f8 = lVar14;
      if (local_e4 == 0) {
        __return_storage_ptr__->kind = REPEATED;
        tVar10 = t1;
        t1 = t0;
      }
      else {
        __return_storage_ptr__->kind = SKIPPED;
        tVar10 = t0;
      }
      (__return_storage_ptr__->pre).__d.__r = tVar10;
      (__return_storage_ptr__->trans).__d.__r = local_f8;
      (__return_storage_ptr__->post).__d.__r = t1;
      goto LAB_0031e356;
    }
    if (tm0.tm_isdst != 0) {
      t0 = t1;
    }
    __return_storage_ptr__->kind = UNIQUE;
  }
  else {
    __return_storage_ptr__->kind = UNIQUE;
    t0 = 0x7fffffffffffffff;
  }
  (__return_storage_ptr__->pre).__d.__r = t0;
  (__return_storage_ptr__->trans).__d.__r = t0;
  (__return_storage_ptr__->post).__d.__r = t0;
LAB_0031e356:
  return __return_storage_ptr__;
}

Assistant:

time_zone::civil_lookup TimeZoneLibC::MakeTime(const civil_second& cs) const {
  if (!local_) {
    // If time_point<seconds> cannot hold the result we saturate.
    static const civil_second min_tp_cs =
        civil_second() + ToUnixSeconds(time_point<seconds>::min());
    static const civil_second max_tp_cs =
        civil_second() + ToUnixSeconds(time_point<seconds>::max());
    const time_point<seconds> tp = (cs < min_tp_cs) ? time_point<seconds>::min()
                                   : (cs > max_tp_cs)
                                       ? time_point<seconds>::max()
                                       : FromUnixSeconds(cs - civil_second());
    return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
  }

  // If tm_year cannot hold the requested year we saturate the result.
  if (cs.year() < 0) {
    if (cs.year() < std::numeric_limits<int>::min() + year_t{1900}) {
      const time_point<seconds> tp = time_point<seconds>::min();
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }
  } else {
    if (cs.year() - year_t{1900} > std::numeric_limits<int>::max()) {
      const time_point<seconds> tp = time_point<seconds>::max();
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }
  }

  // We probe with "is_dst" values of 0 and 1 to try to distinguish unique
  // civil seconds from skipped or repeated ones.  This is not always possible
  // however, as the "dst" flag does not change over some offset transitions.
  // We are also subject to the vagaries of mktime() implementations. For
  // example, some implementations treat "tm_isdst" as a demand (useless),
  // and some as a disambiguator (useful).
  std::time_t t0, t1;
  std::tm tm0, tm1;
  if (make_time(cs, 0, &t0, &tm0) && make_time(cs, 1, &t1, &tm1)) {
    if (tm0.tm_isdst == tm1.tm_isdst) {
      // The civil time was singular (pre == trans == post).
      const time_point<seconds> tp = FromUnixSeconds(tm0.tm_isdst ? t1 : t0);
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }

    tm_gmtoff_t offset = tm_gmtoff(tm0);
    if (t0 < t1) {  // negative DST
      std::swap(t0, t1);
      offset = tm_gmtoff(tm1);
    }

    const std::time_t tt = find_trans(t1, t0, offset);
    const time_point<seconds> trans = FromUnixSeconds(tt);

    if (tm0.tm_isdst) {
      // The civil time did not exist (pre >= trans > post).
      const time_point<seconds> pre = FromUnixSeconds(t0);
      const time_point<seconds> post = FromUnixSeconds(t1);
      return {time_zone::civil_lookup::SKIPPED, pre, trans, post};
    }

    // The civil time was ambiguous (pre < trans <= post).
    const time_point<seconds> pre = FromUnixSeconds(t1);
    const time_point<seconds> post = FromUnixSeconds(t0);
    return {time_zone::civil_lookup::REPEATED, pre, trans, post};
  }

  // make_time() failed somehow so we saturate the result.
  const time_point<seconds> tp = (cs < civil_second())
                                     ? time_point<seconds>::min()
                                     : time_point<seconds>::max();
  return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
}